

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

vector<Direction,_std::allocator<Direction>_> *
read_dirs(vector<Direction,_std::allocator<Direction>_> *__return_storage_ptr__,s_i *x,bool allowrel
         )

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  point p;
  
  (__return_storage_ptr__->super__Vector_base<Direction,_std::allocator<Direction>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Direction,_std::allocator<Direction>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Direction,_std::allocator<Direction>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  do {
    iVar1 = s_i::get(x);
    switch((char)iVar1) {
    case 'a':
      iVar1 = s_i::peek(x,0);
      uVar3 = 1;
      if (iVar1 - 0x30U < 10) {
        uVar2 = s_i::get(x);
        uVar3 = (ulong)(uVar2 & 7);
      }
      std::vector<Direction,std::allocator<Direction>>::emplace_back<point_const&>
                ((vector<Direction,std::allocator<Direction>> *)__return_storage_ptr__,
                 DIRECTION_LIST + uVar3);
      break;
    case 'b':
      p.x = 4;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<int>
                (__return_storage_ptr__,&p.x);
      break;
    case 'c':
      p.x = 6;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<int>
                (__return_storage_ptr__,&p.x);
      break;
    case 'd':
      p.x = 0;
      p.y = 1;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<point>
                (__return_storage_ptr__,&p);
      break;
    case 'e':
      iVar1 = s_i::peek(x,0);
      uVar2 = 1;
      if (iVar1 - 0x30U < 10) {
        uVar2 = s_i::get(x);
        uVar2 = uVar2 & 7;
      }
      p.x = uVar2;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<int>
                (__return_storage_ptr__,&p.x);
      break;
    case 'f':
      p = (point)((ulong)(uint)p.y << 0x20);
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<int>
                (__return_storage_ptr__,&p.x);
      break;
    default:
      __assert_fail("!\"This is not supposed to happen\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/feresum[P]PMA/snails/parse.cpp"
                    ,0x76,"vector<Direction> read_dirs(s_i &, bool)");
    case 'l':
      p.x = -1;
      p.y = 0;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<point>
                (__return_storage_ptr__,&p);
      break;
    case 'n':
      p.x = 2;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<int>
                (__return_storage_ptr__,&p.x);
      p.x = 6;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<int>
                (__return_storage_ptr__,&p.x);
      break;
    case 'o':
      p.x = 1;
      p.y = 0;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<point>
                (__return_storage_ptr__,&p);
      p.x = 0;
      p.y = -1;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<point>
                (__return_storage_ptr__,&p);
      p.x = -1;
      p.y = 0;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<point>
                (__return_storage_ptr__,&p);
      p.x = 0;
      p.y = 1;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<point>
                (__return_storage_ptr__,&p);
      break;
    case 'r':
      p.x = 1;
      p.y = 0;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<point>
                (__return_storage_ptr__,&p);
      break;
    case 's':
      p.x = 0;
      p.y = 0;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<point>
                (__return_storage_ptr__,&p);
      break;
    case 'u':
      p.x = 0;
      p.y = -1;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<point>
                (__return_storage_ptr__,&p);
      break;
    case 'w':
      p.x = 2;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<int>
                (__return_storage_ptr__,&p.x);
      break;
    case 'y':
      p.x = 1;
      p.y = -1;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<point>
                (__return_storage_ptr__,&p);
      p.x = -1;
      p.y = -1;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<point>
                (__return_storage_ptr__,&p);
      p.x = -1;
      p.y = 1;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<point>
                (__return_storage_ptr__,&p);
      p.x = 1;
      p.y = 1;
      std::vector<Direction,_std::allocator<Direction>_>::emplace_back<point>
                (__return_storage_ptr__,&p);
      break;
    case 'z':
      for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 8) {
        p = *(point *)((long)&DIRECTION_LIST[0].x + lVar4);
        std::vector<Direction,std::allocator<Direction>>::emplace_back<point&>
                  ((vector<Direction,std::allocator<Direction>> *)__return_storage_ptr__,&p);
      }
    }
    iVar1 = s_i::peek(x,0);
    uVar2 = iVar1 - 0x61;
  } while ((uVar2 < 0x1a) &&
          (((0x3164809U >> (uVar2 & 0x1f) & 1) != 0 ||
           (((0x402036U >> (uVar2 & 0x1f) & 1) != 0 && (allowrel))))));
  return __return_storage_ptr__;
}

Assistant:

vector<Direction> read_dirs(s_i &x, bool allowrel) {
    vector<Direction> v;
    do {
        char ch = x.get();
        switch (ch) {
        case INST_D_RIGHT:
            v.emplace_back( point{ 1, 0 } );
            break;
        case INST_D_UP:
            v.emplace_back( point{ 0, -1 } );
            break;
        case INST_D_LEFT:
            v.emplace_back( point{ -1, 0 } );
            break;
        case INST_D_DOWN:
            v.emplace_back( point{ 0, 1 } );
            break;
        case INST_D_ORTHOGONAL:
            v.emplace_back( point{ 1, 0 } );
            v.emplace_back( point{ 0, -1 } );
            v.emplace_back( point{ -1, 0 } );
            v.emplace_back( point{ 0, 1 } );
            break;
        case INST_D_DIAGONAL:
            v.emplace_back( point{ 1, -1 } );
            v.emplace_back( point{ -1, -1 } );
            v.emplace_back( point{ -1, 1 } );
            v.emplace_back( point{ 1, 1 } );
            break;
        case INST_D_OCTILINEAR:
            for (point p : DIRECTION_LIST) {
                v.emplace_back( p );
            }
            break;
        case INST_D_CLOCKWISE:
            v.emplace_back( 6 );
            break;
        case INST_D_COUNTERCLOCKWISE:
            v.emplace_back( 2 );
            break;
        case INST_D_FORWARD:
            v.emplace_back( 0 );
            break;
        case INST_D_BACKWARD:
            v.emplace_back( 4 );
            break;
        case INST_D_NORMAL:
            v.emplace_back( 2 );
            v.emplace_back( 6 );
            break;
        case INST_D_STATIONARY:
            v.emplace_back( point{ 0, 0 } );
            break;
        case INST_D_ABSNUM:
            v.emplace_back( DIRECTION_LIST[digit(x.peek()) ? x.get() & 7 : 1] );
            break;
        case INST_D_RELNUM:
            v.emplace_back( digit(x.peek()) ? x.get() & 7 : 1 );
            break;
        default:
            NEVERHAPPEN
        }
    } while (is_dir_inst(x.peek(), allowrel));
    return v;
}